

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O2

void __thiscall ON_SHA1::AccumulateInteger32Array(ON_SHA1 *this,size_t count,ON__INT32 *a)

{
  ON__INT32 *pOVar1;
  ON__INT32 i;
  
  if (a != (ON__INT32 *)0x0 && count != 0) {
    pOVar1 = a + count;
    for (; a < pOVar1; a = a + 1) {
      i = *a;
      Internal_SwapBigEndianUpdate(this,&i,4);
    }
  }
  return;
}

Assistant:

void ON_SHA1::AccumulateInteger32Array(size_t count, const ON__INT32* a)
{
  if (count > 0 && nullptr != a)
  {
    const ON__INT32* a1 = a + count;
    ON__INT32 i;
    while (a < a1)
    {
      i = *a++;
      Internal_SwapBigEndianUpdate(&i, sizeof(i));
    }
  }
}